

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O2

KDataStream * __thiscall
KDIS::PDU::Logistics_Header::Encode(KDataStream *__return_storage_ptr__,Logistics_Header *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream Logistics_Header::Encode() const
{
    KDataStream stream;

    Logistics_Header::Encode( stream );

    return stream;
}